

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O1

void __thiscall ON_Annotation::SetAllowTextScaling(ON_Annotation *this,bool scale)

{
  if (this->m_allow_text_scaling == scale) {
    return;
  }
  this->m_allow_text_scaling = scale;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1b])();
  return;
}

Assistant:

void ON_Annotation::SetAllowTextScaling(bool scale)
{
  // These functions are being added to continue the V5 behavior of
  // per-object text scaling. There is no user interface
  // in V6 or V7 that shows this setting or that allows a user
  // to change this setting.
  // AllowTextScaling() = false means the effective dimstyle value 
  // of DimScale() (model space scale factor) is ignored (treated as if it were 1).
  if (scale != m_allow_text_scaling)
  {
    m_allow_text_scaling = scale ? true : false;
    ClearBoundingBox();
  }
}